

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall Parser::parseUnaryOp(Parser *this)

{
  pointer pTVar1;
  int iVar2;
  Node *pNVar3;
  long lVar4;
  
  iVar2 = this->pos;
  pTVar1 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)iVar2 * 3;
  if (pTVar1[iVar2].type != TK_MINUS) {
    iVar2 = this->pos;
    lVar4 = (long)iVar2 * 3;
    if (pTVar1[iVar2].type != TK_PLUS) {
      iVar2 = this->pos;
      lVar4 = (long)iVar2 * 3;
      if (pTVar1[iVar2].type != TK_INV) {
        iVar2 = this->pos;
        lVar4 = (long)iVar2 * 3;
        if (pTVar1[iVar2].type != TK_NOT) {
          iVar2 = this->pos;
          lVar4 = (long)iVar2 * 3;
          if (pTVar1[iVar2].type != TK_PLUSPLUS) {
            iVar2 = this->pos;
            lVar4 = (long)iVar2 * 3;
            if (pTVar1[iVar2].type != TK_MINUSMINUS) {
              iVar2 = this->pos;
              lVar4 = (long)iVar2 * 3;
              if (pTVar1[iVar2].type != TK_TYPEOF) {
                iVar2 = this->pos;
                lVar4 = (long)iVar2 * 3;
                if (pTVar1[iVar2].type != TK_DELETE) {
                  iVar2 = this->pos;
                  lVar4 = (long)iVar2 * 3;
                  if (pTVar1[iVar2].type != TK_CLONE) {
                    pNVar3 = parseReaderMacro(this);
                    return pNVar3;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->tok = (Token *)(&pTVar1->type + lVar4 * 2);
  this->pos = iVar2 + 1;
  pNVar3 = parseUnaryOp(this);
  pNVar3 = createUnaryPreOpNode(this,(Token *)(&pTVar1->type + lVar4 * 2),pNVar3);
  return pNVar3;
}

Assistant:

Node * parseUnaryOp()
  {
    if (accept(TK_MINUS) || accept(TK_PLUS) || accept(TK_INV) || accept(TK_NOT) || accept(TK_PLUSPLUS) || accept(TK_MINUSMINUS) ||
      accept(TK_TYPEOF) || accept(TK_DELETE) || accept(TK_CLONE))
    {
      Token & opToken = *tok;
      return createUnaryPreOpNode(opToken, parseUnaryOp());
    }
    else
    {
      return parseReaderMacro();
    }
  }